

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Supermap.hpp
# Opt level: O0

optional<supermap::ByteArray<4096UL>_> __thiscall
supermap::Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long>::getValue
          (Supermap<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long> *this,
          Key<128UL> *k)

{
  bool bVar1;
  int iVar2;
  pointer pEVar3;
  undefined4 extraout_var;
  unsigned_long *puVar4;
  KeyValue<supermap::Key<128UL>,_unsigned_long> *pKVar5;
  pointer pKVar6;
  anon_class_1_0_00000001 *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar7;
  _Storage<supermap::ByteArray<4096UL>,_false> in_RDI;
  optional<supermap::ByteArray<4096UL>_> oVar8;
  optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> foundOnDisk;
  optional<unsigned_long> optIndex;
  unsigned_long index;
  ByteArray<4096UL> *in_stack_fffffffffffffe18;
  pointer in_stack_fffffffffffffe20;
  function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
  *this_00;
  undefined1 local_1a8 [160];
  undefined1 local_108 [40];
  function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
  local_e0;
  undefined1 local_c0 [144];
  undefined8 local_30;
  unsigned_long local_20;
  anon_class_1_0_00000001 *local_18;
  
  local_18 = in_RDX;
  pEVar3 = std::
           unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
           ::operator->((unique_ptr<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>,_std::default_delete<supermap::ExtractibleKeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>_>_>
                         *)0x296312);
  iVar2 = (*(pEVar3->super_KeyValueStorage<supermap::Key<128UL>,_unsigned_long,_unsigned_long>).
            _vptr_KeyValueStorage[1])(pEVar3,local_18);
  local_30 = CONCAT44(extraout_var,iVar2);
  bVar1 = std::optional<unsigned_long>::has_value((optional<unsigned_long> *)0x29633f);
  if (bVar1) {
    puVar4 = std::optional<unsigned_long>::value
                       ((optional<unsigned_long> *)in_stack_fffffffffffffe20);
    local_20 = *puVar4;
  }
  else {
    in_stack_fffffffffffffe20 =
         std::
         unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>
         ::operator->((unique_ptr<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>,_std::default_delete<supermap::SortedStoragesList<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>,_supermap::SortedSingleFileIndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>,_supermap::Key<128UL>_>_>_>_>
                       *)0x296370);
    this_00 = &local_e0;
    std::
    function<bool(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::Key<128ul>const&)>
    ::
    function<supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::getValue(supermap::Key<128ul>const&)::_lambda(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::Key<128ul>const&)_1_,void>
              (this_00,local_18);
    std::
    function<bool(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::Key<128ul>const&)>
    ::
    function<supermap::Supermap<supermap::Key<128ul>,supermap::ByteArray<4096ul>,unsigned_long>::getValue(supermap::Key<128ul>const&)::_lambda(supermap::KeyValue<supermap::Key<128ul>,unsigned_long>const&,supermap::Key<128ul>const&)_2_,void>
              (this_00,local_18);
    (**(in_stack_fffffffffffffe20->
       super_Findable<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>,_supermap::Key<128UL>_>
       )._vptr_Findable)(local_c0,in_stack_fffffffffffffe20,local_18,this_00,local_108);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
                 *)0x2963e9);
    std::
    function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
    ::~function((function<bool_(const_supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_&,_const_supermap::Key<128UL>_&)>
                 *)0x2963f6);
    bVar1 = std::optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>::has_value
                      ((optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *)
                       0x296403);
    if (!bVar1) {
      std::optional<supermap::ByteArray<4096UL>_>::optional
                ((optional<supermap::ByteArray<4096UL>_> *)in_RDI);
      uVar7 = extraout_RDX;
      goto LAB_002964a6;
    }
    pKVar5 = std::optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_>::value
                       ((optional<supermap::KeyValue<supermap::Key<128UL>,_unsigned_long>_> *)
                        in_stack_fffffffffffffe20);
    local_20 = pKVar5->value;
  }
  pKVar6 = std::
           unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
           ::operator->((unique_ptr<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>,_std::default_delete<supermap::KeyValueShrinkableStorage<supermap::Key<128UL>,_supermap::ByteArray<4096UL>,_unsigned_long,_std::shared_ptr<supermap::Filter<supermap::Key<128UL>_>_>_>_>_>
                         *)0x296470);
  (*(pKVar6->
    super_IndexedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
    ).
    super_OrderedStorage<supermap::KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>,_unsigned_long,_void>
    ._vptr_OrderedStorage[4])(local_1a8,pKVar6,local_20);
  std::optional<supermap::ByteArray<4096UL>_>::optional<supermap::ByteArray<4096UL>,_true>
            ((optional<supermap::ByteArray<4096UL>_> *)in_stack_fffffffffffffe20,
             in_stack_fffffffffffffe18);
  KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_>::~KeyValue
            ((KeyValue<supermap::Key<128UL>,_supermap::ByteArray<4096UL>_> *)0x2964a6);
  uVar7 = extraout_RDX_00;
LAB_002964a6:
  oVar8.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<4096UL>_>._8_8_ = uVar7;
  oVar8.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
  super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
  super__Optional_payload_base<supermap::ByteArray<4096UL>_>._M_payload = in_RDI;
  return (optional<supermap::ByteArray<4096UL>_>)
         oVar8.super__Optional_base<supermap::ByteArray<4096UL>,_false,_false>._M_payload.
         super__Optional_payload<supermap::ByteArray<4096UL>,_true,_false,_false>.
         super__Optional_payload_base<supermap::ByteArray<4096UL>_>;
}

Assistant:

std::optional<Value> getValue(const Key &k) override {
        IndexT index;
        if (auto optIndex = innerStorage_->getValue(k); optIndex.has_value()) {
            index = optIndex.value();
        } else {
            std::optional<KeyIndex> foundOnDisk = diskIndex_->find(
                k,
                [](const KeyIndex &ki, const Key &key) { return ki.key < key; },
                [](const KeyIndex &ki, const Key &key) { return ki.key == key; }
            );
            if (!foundOnDisk.has_value()) {
                return std::nullopt;
            }
            index = foundOnDisk.value().value;
        }
        return std::optional{diskDataStorage_->get(index).value};
    }